

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  UT_string *em;
  char *pcVar4;
  UT_string *sm;
  UT_array *pUVar5;
  UT_string *pUVar6;
  long lVar7;
  size_t _ut_i;
  ulong uVar8;
  sigset_t ss;
  sigaction sa;
  sigset_t all;
  
  em = (UT_string *)calloc(0x18,1);
  if (em == (UT_string *)0x0) {
LAB_00108579:
    exit(-1);
  }
  pcVar4 = (char *)malloc(100);
  em->d = pcVar4;
  if (pcVar4 == (char *)0x0) goto LAB_00108579;
  em->n = 100;
  *pcVar4 = '\0';
  sm = (UT_string *)calloc(0x18,1);
  if (sm == (UT_string *)0x0) goto LAB_00108579;
  pcVar4 = (char *)malloc(100);
  sm->d = pcVar4;
  if (pcVar4 == (char *)0x0) goto LAB_00108579;
  sm->n = 100;
  *pcVar4 = '\0';
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (iVar1 = getopt(argc,argv,"v+p:Fc:s:tIh"), iVar1 == 0x46) {
              cfg.foreground = 1;
            }
            if (iVar1 != 0x49) break;
            cfg.echo_syslog_to_stderr = 1;
          }
          if (iVar1 != 99) break;
          cfg.file = strdup(_optarg);
        }
        if (iVar1 != 0x70) break;
        cfg.pidfile = strdup(_optarg);
      }
      if (iVar1 != 0x74) break;
      cfg.foreground = 1;
      cfg.test_only = 1;
    }
    if (iVar1 != 0x76) break;
    cfg.verbose = cfg.verbose + 1;
  }
  if (iVar1 != -1) {
    usage(*argv);
    goto LAB_00108579;
  }
  cfg.echo_syslog_to_stderr = 1;
  _Var2 = getpid();
  if (_Var2 == 1) {
    cfg.foreground = 1;
  }
  if ((cfg.echo_syslog_to_stderr == 0) && (iVar1 = isatty(2), iVar1 == 0)) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0x21;
  }
  openlog("pmtr",iVar1,0x80);
  if (cfg.file == (char *)0x0) {
    cfg.file = strdup("/etc/pmtr.conf");
  }
  if (cfg.foreground == 0) {
    _Var2 = fork();
    if (_Var2 != 0) {
      exit(0);
    }
    setsid();
    close(0);
    close(1);
    close(2);
  }
  sigfillset((sigset_t *)&all);
  sigprocmask(2,(sigset_t *)&all,(sigset_t *)0x0);
  pUVar5 = (UT_array *)calloc(1,0x30);
  cfg.jobs = pUVar5;
  (pUVar5->icd).sz = 0x218;
  (pUVar5->icd).init = job_ini;
  (pUVar5->icd).copy = job_cpy;
  (pUVar5->icd).dtor = job_fin;
  pUVar5 = (UT_array *)calloc(1,0x30);
  cfg.listen = pUVar5;
  (pUVar5->icd).sz = 4;
  (pUVar5->icd).init = (undefined1 *)0x0;
  (pUVar5->icd).copy = (ctor_f *)0x0;
  (pUVar5->icd).dtor = (undefined1 *)0x0;
  pUVar5 = (UT_array *)calloc(1,0x30);
  cfg.report = pUVar5;
  (pUVar5->icd).sz = 4;
  (pUVar5->icd).init = (undefined1 *)0x0;
  (pUVar5->icd).copy = (ctor_f *)0x0;
  (pUVar5->icd).dtor = (undefined1 *)0x0;
  pUVar6 = (UT_string *)calloc(0x18,1);
  cfg.s = pUVar6;
  if (pUVar6 == (UT_string *)0x0) goto LAB_00108579;
  pcVar4 = (char *)malloc(100);
  pUVar6->n = 0;
  pUVar6->i = 0;
  pUVar6->d = pcVar4;
  if (pcVar4 == (char *)0x0) goto LAB_00108579;
  pUVar6->n = 100;
  *pcVar4 = '\0';
  iVar1 = make_pidfile();
  if (iVar1 != 0) goto LAB_001081ae;
  umask(0);
  iVar1 = instantiate_cfg_file(&cfg);
  if (iVar1 == -1) goto LAB_001081ae;
  iVar1 = parse_jobs(&cfg,em);
  if (iVar1 == -1) {
    syslog(3,"parse failed: %s",em->d);
    goto LAB_001081ae;
  }
  if (cfg.test_only != 0) goto LAB_001081ae;
  syslog(6,"pmtr: starting");
  sigfillset((sigset_t *)&ss);
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
    sigdelset((sigset_t *)&ss,*(int *)((long)sigs + lVar7));
  }
  sa.__sigaction_handler.sa_handler = sighandler;
  sa.sa_flags = 0;
  sigfillset((sigset_t *)&sa.sa_mask);
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
    sigaction(*(int *)((long)sigs + lVar7),(sigaction *)&sa,(sigaction *)0x0);
  }
  uVar3 = __sigsetjmp(jmp,1);
  if (uVar3 == 0x1d) {
    service_socket(&cfg);
LAB_00108527:
    do_jobs(&cfg);
LAB_0010852c:
    sigsuspend((sigset_t *)&ss);
  }
  else {
    if (uVar3 == 1) {
      rescan_config();
      goto LAB_00108527;
    }
    if (uVar3 == 0xe) {
      do_jobs(&cfg);
LAB_001084eb:
      report_status(&cfg);
      alarm_within(&cfg,10);
      goto LAB_0010852c;
    }
    if (uVar3 == 0x11) {
      collect_jobs(&cfg,sm);
      goto LAB_00108527;
    }
    if (uVar3 == 0) {
      iVar1 = setup_logger();
      if ((iVar1 < 0) || (cfg.logger_pid = start_logger(), cfg.logger_pid == -1)) goto LAB_001081ae;
      do_jobs(&cfg);
      cfg.dm_pid = dep_monitor(cfg.file);
      if (cfg.dm_pid == -1) goto LAB_001081ae;
      goto LAB_001084eb;
    }
    syslog(6,"pmtr: exiting on signal %d",(ulong)uVar3);
  }
  term_jobs(cfg.jobs);
  do_jobs(&cfg);
  nanosleep((timespec *)&halfsec,(timespec *)0x0);
  collect_jobs(&cfg,sm);
LAB_001081ae:
  close_sockets(&cfg);
  free(cfg.file);
  if ((cfg.jobs)->n != 0) {
    if (((cfg.jobs)->icd).dtor != (undefined1 *)0x0) {
      for (uVar8 = 0; uVar8 < (cfg.jobs)->i; uVar8 = uVar8 + 1) {
        (*(code *)((cfg.jobs)->icd).dtor)((cfg.jobs)->d + ((cfg.jobs)->icd).sz * uVar8);
      }
    }
    free((cfg.jobs)->d);
  }
  free(cfg.jobs);
  if ((cfg.listen)->n != 0) {
    if (((cfg.listen)->icd).dtor != (undefined1 *)0x0) {
      for (uVar8 = 0; uVar8 < (cfg.listen)->i; uVar8 = uVar8 + 1) {
        (*(code *)((cfg.listen)->icd).dtor)((cfg.listen)->d + ((cfg.listen)->icd).sz * uVar8);
      }
    }
    free((cfg.listen)->d);
  }
  free(cfg.listen);
  if ((cfg.report)->n != 0) {
    if (((cfg.report)->icd).dtor != (undefined1 *)0x0) {
      for (uVar8 = 0; uVar8 < (cfg.report)->i; uVar8 = uVar8 + 1) {
        (*(code *)((cfg.report)->icd).dtor)((cfg.report)->d + ((cfg.report)->icd).sz * uVar8);
      }
    }
    free((cfg.report)->d);
  }
  free(cfg.report);
  free((cfg.s)->d);
  free(cfg.s);
  free(em->d);
  free(em);
  free(sm->d);
  free(sm);
  if (cfg.pidfile != (char *)0x0) {
    unlink(cfg.pidfile);
    free(cfg.pidfile);
  }
  if (cfg.logger_fd != -1) {
    close(cfg.logger_fd);
  }
  return 0;
}

Assistant:

int main (int argc, char *argv[]) {
  int n, opt, log_opt;
  job_t *job;

  UT_string *em, *sm;
  utstring_new(em);
  utstring_new(sm);

  while ( (opt = getopt(argc, argv, "v+p:Fc:s:tIh")) != -1) {
    switch (opt) {
      case 'v': cfg.verbose++; break;
      case 'p': cfg.pidfile=strdup(optarg); break;
      case 'F': cfg.foreground=1; break;
      case 'I': cfg.echo_syslog_to_stderr=1; break;
      case 'c': cfg.file=strdup(optarg); break;
      case 't': cfg.test_only=1; cfg.foreground=1; break;
      case 'h': default: usage(argv[0]); break;
    }
  }

  /* always on, nowadays */
  cfg.echo_syslog_to_stderr = 1;

  /* as a container main process, stay in foreground */
  if (getpid() == 1) cfg.foreground = 1;

  log_opt = LOG_PID;
  if (cfg.echo_syslog_to_stderr || isatty(STDERR_FILENO)) log_opt |= LOG_PERROR;
  openlog("pmtr", log_opt, LOG_LOCAL0);
  if (!cfg.file) cfg.file = strdup(DEFAULT_PMTR_CONFIG);

  if (!cfg.foreground) {       /* daemon init */
    if (fork() != 0) exit(0);  /* parent exit */
    setsid();                  /* new session - no controlling terminal */
    close(STDIN_FILENO);
    close(STDOUT_FILENO);
    close(STDERR_FILENO);
  }

  /* block all signals. we remain fully blocked except in sigsuspend */
  sigset_t all;
  sigfillset(&all);
  sigprocmask(SIG_SETMASK,&all,NULL);

  utarray_new(cfg.jobs, &job_mm);
  utarray_new(cfg.listen, &ut_int_icd);
  utarray_new(cfg.report, &ut_int_icd);
  utstring_new(cfg.s);

  if (make_pidfile()) goto final;
  umask(0);

  /* parse config file. we blocked signals above because we can get SIGIO 
   * during parsing if we open UDP listeners and get any datagrams */
  if (instantiate_cfg_file(&cfg) == -1) goto final;
  if (parse_jobs(&cfg, em) == -1) {
    syslog(LOG_ERR,"parse failed: %s", utstring_body(em));
    goto final;
  }

  if (cfg.test_only) goto final;
  syslog(LOG_INFO,"pmtr: starting");

  /* define a smaller set of signals to block within sigsuspend. */
  sigset_t ss;
  sigfillset(&ss);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigdelset(&ss, sigs[n]);

  /* establish handlers for signals that we'll unblock in sigsuspend */
  struct sigaction sa;
  sa.sa_handler = sighandler;
  sa.sa_flags = 0;
  sigfillset(&sa.sa_mask);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigaction(sigs[n], &sa, NULL);

  /* here is a special line. we'll come back here whenever a signal happens */
  int signo = sigsetjmp(jmp,1);

  switch(signo) {
    case 0:   /* not a signal yet, first time setup */
      if (setup_logger() < 0) goto final;
      cfg.logger_pid = start_logger();
      if (cfg.logger_pid == (pid_t)-1) goto final;
      do_jobs(&cfg);
      cfg.dm_pid = dep_monitor(cfg.file);
      if (cfg.dm_pid == (pid_t)-1) goto final;
      report_status(&cfg);
      alarm_within(&cfg,SHORT_DELAY);
      break;
    case SIGHUP:
      rescan_config();
      do_jobs(&cfg);
      break;
    case SIGCHLD:
      collect_jobs(&cfg,sm);
      do_jobs(&cfg);
      break;
    case SIGALRM:
      do_jobs(&cfg);
      report_status(&cfg);
      alarm_within(&cfg,SHORT_DELAY);
      break;
    case SIGIO:  /* our UDP listener (if enabled) got a datagram */
      service_socket(&cfg);
      do_jobs(&cfg);
      break;
    default:
      syslog(LOG_INFO,"pmtr: exiting on signal %d", signo);
      goto done;
      break;
  }

  /* wait for signals */
  sigsuspend(&ss);

  /* the only way to get past this point 
   * is from the "goto done" above, because 
   * sigsuspend waits for signals, and when
   * one arrives we longjmp back to sigsetjmp! */

 done:
  term_jobs(cfg.jobs);      /* just sets termination flag, so */
  do_jobs(&cfg);            /* run this loop to issue signals */
  nanosleep(&halfsec,NULL); /* a little time to let them exit */
  collect_jobs(&cfg,sm);    /* collect any jobs that exited */

 final:
  close_sockets(&cfg);
  free(cfg.file);
  utarray_free(cfg.jobs);
  utarray_free(cfg.listen);
  utarray_free(cfg.report);
  utstring_free(cfg.s);
  utstring_free(em);
  utstring_free(sm);
  if (cfg.pidfile) {unlink(cfg.pidfile); free(cfg.pidfile);}
  if (cfg.logger_fd != -1) close(cfg.logger_fd);
  return 0;
}